

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_io.c
# Opt level: O3

size_t duckdb_je_malloc_vsnprintf(char *str,size_t size,char *format,__va_list_tag *ap)

{
  char *pcVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  long lVar7;
  char cVar8;
  uintmax_t uVar9;
  int *piVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  byte bVar14;
  uint *puVar15;
  undefined7 uVar19;
  undefined8 *puVar16;
  ulong *puVar17;
  uintmax_t uVar18;
  byte bVar20;
  uint uVar21;
  uint *puVar22;
  char *pcVar23;
  ulong uVar24;
  uint uVar25;
  char *in_R8;
  char cVar26;
  char *in_R9;
  char *pcVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  ulong uVar32;
  __va_list_tag _Stack_180;
  undefined1 auStack_160 [24];
  uint *puStack_148;
  char *pcStack_140;
  char *pcStack_138;
  ulong uStack_b0;
  char local_a5;
  uint local_a4;
  __va_list_tag *local_a0;
  char *f;
  uintmax_t local_90;
  char *local_88;
  uint local_80;
  undefined4 local_7c;
  char buf [66];
  
  uVar30 = 0;
  local_a0 = ap;
  local_88 = str;
LAB_001edc16:
  bVar20 = *format;
  if (bVar20 == 0x25) {
    local_7c = 0;
    local_80 = 0;
    local_a4 = 0;
    bVar4 = false;
LAB_001edc50:
    f = (char *)((byte *)format + 1);
    bVar3 = bVar4;
switchD_001edc7c_caseD_3:
    bVar4 = bVar3;
    format = f;
    bVar20 = *format;
    uVar21 = (uint)bVar20;
    f = (char *)((byte *)format + 1);
    puVar22 = (uint *)(ulong)(bVar20 - 0x20);
    puVar15 = puVar22;
    if (bVar20 - 0x20 < 0x1a) goto code_r0x001edc73;
    goto switchD_001edc7c_caseD_1;
  }
  if (bVar20 == 0) {
    uVar11 = size - 1;
    if (uVar30 < size) {
      uVar11 = uVar30;
    }
    str[uVar11] = '\0';
    return uVar30;
  }
  pcVar27 = in_R9;
  if (uVar30 < size) {
    str[uVar30] = bVar20;
  }
LAB_001edc30:
  uVar30 = uVar30 + 1;
  goto LAB_001edc33;
code_r0x001edc73:
  puVar15 = (uint *)((long)&switchD_001edc7c::switchdataD_0141a3d8 +
                    (long)(int)(&switchD_001edc7c::switchdataD_0141a3d8)[(long)puVar22]);
  bVar3 = true;
  switch(puVar22) {
  case (uint *)0x0:
    goto switchD_001edc7c_caseD_0;
  default:
    goto switchD_001edc7c_caseD_1;
  case (uint *)0x3:
    goto switchD_001edc7c_caseD_3;
  case (uint *)0xa:
    uVar21 = ap->gp_offset;
    if ((ulong)uVar21 < 0x29) {
      puVar15 = (uint *)((ulong)uVar21 + (long)ap->reg_save_area);
      ap->gp_offset = uVar21 + 8;
    }
    else {
      puVar15 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar15 + 2;
    }
    uVar21 = *puVar15;
    uVar25 = -uVar21;
    if (0 < (int)uVar21) {
      uVar25 = uVar21;
    }
    uVar9 = (uintmax_t)uVar25;
    puVar15 = (uint *)(ulong)local_a4;
    if ((int)uVar21 < 0) {
      puVar15 = (uint *)&DAT_00000001;
    }
    local_a4 = (uint)puVar15;
    uVar21 = 0x20;
    goto LAB_001edcd3;
  case (uint *)0xb:
    local_7c = 1;
    goto LAB_001edc50;
  case (uint *)0xd:
    local_a4 = 1;
    goto LAB_001edc50;
  case (uint *)0x10:
    break;
  case (uint *)0x11:
  case (uint *)0x12:
  case (uint *)0x13:
  case (uint *)0x14:
  case (uint *)0x15:
  case (uint *)0x16:
  case (uint *)0x17:
  case (uint *)0x18:
  case (uint *)0x19:
    uVar21 = 0x20;
  }
  uStack_b0 = 0x1edca4;
  f = format;
  piVar10 = __errno_location();
  *piVar10 = 0;
  uStack_b0 = 0x1edcba;
  uVar9 = duckdb_je_malloc_strtoumax(format,&f,10);
  str = local_88;
  ap = local_a0;
LAB_001edcd3:
  in_R9 = (char *)(ulong)uVar21;
  bVar20 = *f;
  goto LAB_001edcd9;
switchD_001edc7c_caseD_0:
  local_80 = 1;
  goto LAB_001edc50;
switchD_001edc7c_caseD_1:
  in_R9 = (char *)CONCAT71((int7)((ulong)in_R9 >> 8),0x20);
  uVar9 = 0xffffffff;
  f = format;
LAB_001edcd9:
  if (bVar20 == 0x2e) {
    pcVar27 = f + 1;
    bVar20 = f[1];
    puVar15 = (uint *)CONCAT71((int7)((ulong)puVar15 >> 8),bVar20);
    if (bVar20 - 0x30 < 10) {
      in_R9 = (char *)((ulong)in_R9 & 0xffffffff);
      uStack_b0 = 0x1edd03;
      f = pcVar27;
      piVar10 = __errno_location();
      *piVar10 = 0;
      uStack_b0 = 0x1edd16;
      uStack_b0 = duckdb_je_malloc_strtoumax(pcVar27,&f,10);
      str = local_88;
      ap = local_a0;
      goto LAB_001edd34;
    }
    uStack_b0 = 0xffffffffffffffff;
    if (bVar20 == 0x2a) {
      uVar21 = ap->gp_offset;
      if ((ulong)uVar21 < 0x29) {
        puVar22 = (uint *)((ulong)uVar21 + (long)ap->reg_save_area);
        puVar15 = (uint *)(ulong)(uVar21 + 8);
        ap->gp_offset = uVar21 + 8;
      }
      else {
        puVar22 = (uint *)ap->overflow_arg_area;
        puVar15 = puVar22 + 2;
        ap->overflow_arg_area = puVar15;
      }
      uStack_b0 = (ulong)*puVar22;
      f = f + 2;
      goto LAB_001edd34;
    }
  }
  else {
    uStack_b0 = 0xffffffffffffffff;
LAB_001edd34:
    puVar15 = (uint *)CONCAT71((int7)((ulong)puVar15 >> 8),*f);
    pcVar27 = f;
  }
  f = pcVar27;
  uVar21 = ((uint)puVar15 & 0xff) - 0x6a;
  uVar19 = (undefined7)((ulong)puVar15 >> 8);
  if (uVar21 < 0x11) {
    if ((0x10481U >> (uVar21 & 0x1f) & 1) != 0) {
      f = f + 1;
      goto LAB_001edd5f;
    }
    if (uVar21 != 2) goto LAB_001eded5;
    bVar20 = f[1];
    puVar15 = (uint *)CONCAT71(uVar19,0x6c);
    pcVar27 = f + 1;
    if (bVar20 == 0x6c) {
      f = f + 2;
      puVar15 = (uint *)CONCAT71(uVar19,0x71);
      goto LAB_001edd5f;
    }
  }
  else {
LAB_001eded5:
    puVar15 = (uint *)CONCAT71(uVar19,0x3f);
LAB_001edd5f:
    bVar20 = *f;
    pcVar27 = f;
  }
  f = pcVar27;
  format = f;
  uVar11 = (ulong)(bVar20 - 0x6f);
  uVar21 = (uint)uVar9;
  uVar28 = (ulong)(int)uVar21;
  bVar14 = (byte)puVar15;
  cVar26 = (char)in_R9;
  pcVar27 = in_R9;
  local_90 = uVar9;
  if (bVar20 - 0x6f < 10) {
    puVar22 = (uint *)((long)&switchD_001edd8a::switchdataD_0141a440 +
                      (long)(int)(&switchD_001edd8a::switchdataD_0141a440)[uVar11]);
    in_R8 = (char *)0xa;
    switch(uVar11) {
    case 0:
      bVar14 = bVar14 | 0x80;
      uVar25 = ap->gp_offset;
      uVar11 = (ulong)uVar25;
      if (bVar14 == 0xfa) {
        if (uVar25 < 0x29) {
          pvVar2 = ap->reg_save_area;
LAB_001ee62c:
          puVar17 = (ulong *)((long)pvVar2 + uVar11);
          ap->gp_offset = uVar25 + 8;
        }
        else {
LAB_001ee634:
          puVar17 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar17 + 1;
        }
LAB_001ee640:
        uVar11 = *puVar17;
      }
      else {
        if (bVar14 == 0xea) {
LAB_001eddca:
          if (0x28 < uVar25) goto LAB_001ee634;
          puVar17 = (ulong *)((long)ap->reg_save_area + uVar11);
          ap->gp_offset = uVar25 + 8;
          goto LAB_001ee640;
        }
        if (bVar14 == 0xec) {
          if (uVar25 < 0x29) {
            pvVar2 = ap->reg_save_area;
            goto LAB_001ee62c;
          }
          goto LAB_001ee634;
        }
        if (bVar14 == 0xf1) goto LAB_001eddca;
        if (uVar25 < 0x29) {
          puVar15 = (uint *)(uVar11 + (long)ap->reg_save_area);
          ap->gp_offset = uVar25 + 8;
        }
        else {
          puVar15 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar15 + 2;
        }
        uVar11 = (ulong)*puVar15;
      }
      pcVar27 = "0123456789abcdefghijklmnopqrstuvwxyz";
      buf[0x40] = '\0';
      lVar29 = 0;
      do {
        uVar32 = (ulong)((int)lVar29 + 0x3f);
        cVar8 = "0123456789abcdefghijklmnopqrstuvwxyz"[(uint)uVar11 & 7];
        buf[uVar32] = cVar8;
        lVar29 = lVar29 + -1;
        bVar3 = 7 < uVar11;
        uVar11 = uVar11 >> 3;
      } while (bVar3);
      pcVar23 = buf + uVar32;
      uVar11 = -lVar29;
      if ((bVar4) && (cVar8 != '0')) {
        uVar11 = 1 - lVar29;
        buf[uVar32 - 1] = '0';
        pcVar23 = buf + (uVar32 - 1);
      }
      in_R8 = (char *)((ulong)in_R9 & 0xff);
      if (uVar21 == 0xffffffff) {
        local_90 = 0;
        uVar32 = 0;
      }
      else {
        uVar32 = 0;
        if (uVar11 <= uVar28) {
          uVar32 = uVar28 - uVar11;
        }
        local_90 = CONCAT71((int7)((ulong)lVar29 >> 8),uVar11 <= uVar28 && uVar28 - uVar11 != 0);
        if (((local_a4 & 1) == 0) && (uVar11 < uVar28)) {
          pcVar1 = str + uVar30;
          uVar28 = 0;
          do {
            if (uVar28 + uVar30 < size) {
              pcVar1[uVar28] = cVar26;
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 < uVar32);
          uVar30 = uVar30 + uVar28;
          local_90 = CONCAT71((int7)((ulong)pcVar1 >> 8),1);
        }
      }
      uVar28 = size - uVar30;
      uVar18 = local_90;
      local_a5 = cVar26;
      if (uVar30 <= size && uVar28 != 0) {
        if (uVar11 < uVar28) {
          uVar28 = uVar11;
        }
        uStack_b0 = 0x1ee719;
        switchD_00b03519::default(str + uVar30,pcVar23,uVar28);
        uVar18 = local_90;
        str = local_88;
        ap = local_a0;
        uVar9 = local_90;
      }
      local_90 = uVar9;
      uVar30 = uVar30 + uVar11;
      if (((byte)local_a4 & (byte)uVar18 & 1) != 0) {
        for (; uVar32 != 0; uVar32 = uVar32 - 1) {
          if (uVar30 < size) {
            str[uVar30] = ' ';
          }
          uVar30 = uVar30 + 1;
        }
      }
      goto LAB_001edc33;
    case 1:
      uVar25 = ap->gp_offset;
      if ((ulong)uVar25 < 0x29) {
        puVar17 = (ulong *)((ulong)uVar25 + (long)ap->reg_save_area);
        ap->gp_offset = uVar25 + 8;
      }
      else {
        puVar17 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar17 + 1;
      }
      in_R8 = "0123456789abcdef";
      buf[0x40] = '\0';
      lVar29 = -2;
      uVar11 = *puVar17;
      do {
        uVar32 = (ulong)((int)lVar29 + 0x41);
        buf[uVar32] = "0123456789abcdef"[(uint)uVar11 & 0xf];
        lVar29 = lVar29 + -1;
        bVar4 = 0xf < uVar11;
        uVar11 = uVar11 >> 4;
      } while (bVar4);
      uVar11 = -lVar29;
      (buf + (uVar32 - 2))[0] = '0';
      (buf + (uVar32 - 2))[1] = 'x';
      if (uVar21 == 0xffffffff) {
        local_90 = 0;
        uVar24 = 0;
      }
      else {
        uVar24 = 0;
        if (uVar11 <= uVar28) {
          uVar24 = uVar28 + lVar29;
        }
        local_90 = (uintmax_t)(uVar11 <= uVar28 && uVar28 + lVar29 != 0);
        if (((local_a4 & 1) == 0) && (uVar11 < uVar28)) {
          pcVar23 = str + uVar30;
          uVar28 = 0;
          do {
            in_R8 = (char *)(uVar28 + uVar30);
            if (in_R8 < size) {
              pcVar23[uVar28] = cVar26;
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 < uVar24);
          uVar30 = uVar30 + uVar28;
          local_90 = CONCAT71((int7)((ulong)pcVar23 >> 8),1);
        }
      }
      uVar28 = size - uVar30;
      uVar18 = local_90;
      if (uVar30 <= size && uVar28 != 0) {
        if (uVar11 < uVar28) {
          uVar28 = uVar11;
        }
        uStack_b0 = 0x1ee438;
        switchD_00b03519::default(str + uVar30,buf + (uVar32 - 2),uVar28);
        uVar18 = local_90;
        str = local_88;
        pcVar27 = in_R9;
        ap = local_a0;
        uVar9 = local_90;
      }
      local_90 = uVar9;
      uVar30 = uVar30 - lVar29;
      if (((byte)local_a4 & (byte)uVar18 & 1) != 0) {
        for (; uVar24 != 0; uVar24 = uVar24 - 1) {
          if (uVar30 < size) {
            str[uVar30] = ' ';
          }
          uVar30 = uVar30 + 1;
        }
      }
      goto LAB_001edc33;
    default:
      goto duckdb_je_malloc_snprintf;
    case 4:
      uVar21 = ap->gp_offset;
      if ((ulong)uVar21 < 0x29) {
        puVar16 = (undefined8 *)((ulong)uVar21 + (long)ap->reg_save_area);
        ap->gp_offset = uVar21 + 8;
      }
      else {
        puVar16 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar16 + 1;
      }
      pcVar27 = (char *)*puVar16;
      if ((int)uStack_b0 < 0) {
        uStack_b0 = 0x1ee35d;
        sVar12 = strlen(pcVar27);
        in_R9 = (char *)((ulong)in_R9 & 0xffffffff);
        str = local_88;
        ap = local_a0;
      }
      else {
        sVar12 = uStack_b0 & 0xffffffff;
      }
      lVar29 = uVar28 - sVar12;
      if (uVar28 < sVar12) {
        lVar29 = 0;
      }
      if ((int)local_90 == -1) {
        lVar29 = 0;
      }
      lVar7 = lVar29;
      if ((local_a4 & 1) == 0) {
        for (; lVar7 != 0; lVar7 = lVar7 + -1) {
          if (uVar30 < size) {
            str[uVar30] = (char)in_R9;
          }
          uVar30 = uVar30 + 1;
        }
      }
      uVar11 = size - uVar30;
      if (uVar30 <= size && uVar11 != 0) {
        if (sVar12 < uVar11) {
          uVar11 = sVar12;
        }
        uStack_b0 = 0x1ee3c3;
        switchD_00b03519::default(str + uVar30,pcVar27,uVar11);
        str = local_88;
        ap = local_a0;
      }
      uVar30 = uVar30 + sVar12;
      if ((local_a4 & 1) != 0) {
        for (; lVar29 != 0; lVar29 = lVar29 + -1) {
          if (uVar30 < size) {
            str[uVar30] = ' ';
          }
          uVar30 = uVar30 + 1;
        }
      }
LAB_001ee3f5:
      format = format + 1;
      goto LAB_001edc16;
    case 6:
      bVar14 = bVar14 | 0x80;
      uVar25 = ap->gp_offset;
      uVar11 = (ulong)uVar25;
      if (bVar14 == 0xfa) {
        if (uVar25 < 0x29) {
          pvVar2 = ap->reg_save_area;
LAB_001ee77a:
          puVar17 = (ulong *)((long)pvVar2 + uVar11);
          ap->gp_offset = uVar25 + 8;
        }
        else {
LAB_001ee782:
          puVar17 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar17 + 1;
        }
LAB_001ee78e:
        uVar11 = *puVar17;
      }
      else {
        if (bVar14 == 0xea) {
LAB_001edf6b:
          if (0x28 < uVar25) goto LAB_001ee782;
          puVar17 = (ulong *)((long)ap->reg_save_area + uVar11);
          ap->gp_offset = uVar25 + 8;
          goto LAB_001ee78e;
        }
        if (bVar14 == 0xec) {
          if (uVar25 < 0x29) {
            pvVar2 = ap->reg_save_area;
            goto LAB_001ee77a;
          }
          goto LAB_001ee782;
        }
        if (bVar14 == 0xf1) goto LAB_001edf6b;
        if (uVar25 < 0x29) {
          puVar15 = (uint *)(uVar11 + (long)ap->reg_save_area);
          ap->gp_offset = uVar25 + 8;
        }
        else {
          puVar15 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar15 + 2;
        }
        uVar11 = (ulong)*puVar15;
      }
      buf[0x40] = '\0';
      iVar31 = 0;
      do {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar11;
        uVar25 = iVar31 + 0x3f;
        buf[uVar25] = "0123456789"[uVar11 % 10];
        iVar31 = iVar31 + -1;
        bVar4 = 9 < uVar11;
        uVar11 = SUB168(auVar5 / ZEXT816(10),0);
      } while (bVar4);
      uVar11 = (ulong)(uint)-iVar31;
      if (uVar21 == 0xffffffff) {
        local_90 = 0;
        uVar32 = 0;
      }
      else {
        uVar32 = 0;
        if (uVar11 <= uVar28) {
          uVar32 = uVar28 - uVar11;
        }
        local_90 = CONCAT71(SUB167(auVar5 / ZEXT816(10),1),uVar11 <= uVar28 && uVar28 - uVar11 != 0)
        ;
        if (((local_a4 & 1) == 0) && (uVar11 < uVar28)) {
          pcVar23 = str + uVar30;
          uVar28 = 0;
          do {
            if (uVar28 + uVar30 < size) {
              pcVar23[uVar28] = cVar26;
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 < uVar32);
          uVar30 = uVar30 + uVar28;
          local_90 = CONCAT71((int7)((ulong)pcVar23 >> 8),1);
        }
      }
      uVar28 = size - uVar30;
      uVar18 = local_90;
      if (uVar30 <= size && uVar28 != 0) {
        if (uVar11 < uVar28) {
          uVar28 = uVar11;
        }
        uStack_b0 = 0x1ee838;
        switchD_00b03519::default(str + uVar30,buf + uVar25,uVar28);
        uVar18 = local_90;
        str = local_88;
        pcVar27 = in_R9;
        ap = local_a0;
        uVar9 = local_90;
      }
      local_90 = uVar9;
      uVar30 = uVar30 + uVar11;
      if (((byte)local_a4 & (byte)uVar18 & 1) != 0) {
        for (; uVar32 != 0; uVar32 = uVar32 - 1) {
          if (uVar30 < size) {
            str[uVar30] = ' ';
          }
          uVar30 = uVar30 + 1;
        }
      }
      goto LAB_001edc33;
    case 9:
      goto switchD_001edd8a_caseD_9;
    }
  }
  if (bVar20 != 0x69) {
    if (bVar20 == 0x58) goto switchD_001edd8a_caseD_9;
    if (bVar20 == 99) {
      uVar25 = ap->gp_offset;
      if ((ulong)uVar25 < 0x29) {
        pcVar27 = (char *)((ulong)uVar25 + (long)ap->reg_save_area);
        ap->gp_offset = uVar25 + 8;
      }
      else {
        pcVar27 = (char *)ap->overflow_arg_area;
        ap->overflow_arg_area = pcVar27 + 8;
      }
      cVar8 = *pcVar27;
      lVar29 = uVar28 - 1;
      if (uVar21 < 2) {
        lVar29 = 0;
      }
      if (uVar21 == 0xffffffff) {
        lVar29 = 0;
      }
      lVar7 = lVar29;
      if ((local_a4 & 1) == 0) {
        for (; lVar7 != 0; lVar7 = lVar7 + -1) {
          if (uVar30 < size) {
            str[uVar30] = cVar26;
          }
          uVar30 = uVar30 + 1;
        }
      }
      if (uVar30 < size) {
        str[uVar30] = cVar8;
      }
      uVar30 = uVar30 + 1;
      if ((local_a4 & 1) != 0) {
        for (; lVar29 != 0; lVar29 = lVar29 + -1) {
          if (uVar30 < size) {
            str[uVar30] = ' ';
          }
          uVar30 = uVar30 + 1;
        }
      }
      goto LAB_001ee3f5;
    }
    if (bVar20 != 100) {
      if (uVar30 < size) {
        str[uVar30] = '%';
      }
      goto LAB_001edc30;
    }
  }
  uVar25 = ap->gp_offset;
  uVar32 = (ulong)uVar25;
  uVar6 = (uint)puVar15 & 0xff;
  if (uVar6 - 0x6a < 0xb) {
    puVar22 = &switchD_001ede2d::switchdataD_0141a468;
    puVar15 = (uint *)((long)&switchD_001ede2d::switchdataD_0141a468 +
                      (long)(int)(&switchD_001ede2d::switchdataD_0141a468)[uVar6 - 0x6a]);
    local_a5 = cVar26;
    switch(uVar6) {
    case 0x6a:
      if (uVar25 < 0x29) {
        puVar17 = (ulong *)((long)ap->reg_save_area + uVar32);
        ap->gp_offset = uVar25 + 8;
      }
      else {
LAB_001ee4ac:
        puVar17 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar17 + 1;
      }
      goto LAB_001ee4b8;
    default:
duckdb_je_malloc_snprintf:
      uStack_b0 = 10;
      _Stack_180.reg_save_area = auStack_160;
      _Stack_180.overflow_arg_area = &local_a0;
      _Stack_180.gp_offset = 0x18;
      _Stack_180.fp_offset = 0x30;
      puStack_148 = puVar15;
      pcStack_140 = in_R8;
      pcStack_138 = in_R9;
      sVar13 = duckdb_je_malloc_vsnprintf(str,uVar11,(char *)puVar22,&_Stack_180);
      return sVar13;
    case 0x6c:
    case 0x71:
    case 0x74:
switchD_001ede2d_caseD_6c:
      if (0x28 < uVar25) goto LAB_001ee4ac;
      pvVar2 = ap->reg_save_area;
      break;
    case 0x70:
      if (0x28 < uVar25) goto LAB_001ee4ac;
      pvVar2 = ap->reg_save_area;
    }
    puVar17 = (ulong *)((long)pvVar2 + uVar32);
    ap->gp_offset = uVar25 + 8;
LAB_001ee4b8:
    pcVar27 = (char *)*puVar17;
  }
  else {
    if (uVar6 == 0x7a) goto switchD_001ede2d_caseD_6c;
    if (uVar25 < 0x29) {
      piVar10 = (int *)(uVar32 + (long)ap->reg_save_area);
      ap->gp_offset = uVar25 + 8;
    }
    else {
      piVar10 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar10 + 2;
    }
    pcVar27 = (char *)(long)*piVar10;
  }
  cVar8 = '-';
  if ((local_80 & 1) != 0) {
    cVar8 = ' ';
  }
  pcVar23 = (char *)-(long)pcVar27;
  if (0 < (long)pcVar27) {
    pcVar23 = pcVar27;
  }
  buf[0x40] = '\0';
  iVar31 = 0;
  do {
    uVar11 = (ulong)(iVar31 + 0x3f);
    buf[uVar11] = "0123456789"[(ulong)pcVar23 % 10];
    iVar31 = iVar31 + -1;
    bVar4 = (char *)0x9 < pcVar23;
    pcVar23 = (char *)((ulong)pcVar23 / 10);
  } while (bVar4);
  pcVar23 = buf;
  if ((local_7c & 1) != 0) {
    cVar8 = '+';
  }
  uVar32 = (ulong)(uint)-iVar31;
  if ((long)pcVar27 < 0) {
    cVar8 = '-';
LAB_001ee525:
    uVar32 = uVar32 + 1;
    buf[uVar11 - 1] = cVar8;
    pcVar23 = (char *)((long)&local_7c + 3);
  }
  else if (cVar8 != '-') goto LAB_001ee525;
  in_R8 = (char *)((ulong)in_R9 & 0xff);
  if (uVar21 == 0xffffffff) {
    local_90 = 0;
    uVar24 = 0;
  }
  else {
    uVar24 = 0;
    if (uVar32 <= uVar28) {
      uVar24 = uVar28 - uVar32;
    }
    local_90 = (uintmax_t)(uVar32 <= uVar28 && uVar28 - uVar32 != 0);
    if (((local_a4 & 1) == 0) && (uVar32 < uVar28)) {
      pcVar1 = str + uVar30;
      uVar28 = 0;
      do {
        if (uVar28 + uVar30 < size) {
          pcVar1[uVar28] = cVar26;
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < uVar24);
      uVar30 = uVar30 + uVar28;
      local_90 = CONCAT71((int7)((ulong)pcVar1 >> 8),1);
    }
  }
  uVar28 = size - uVar30;
  uVar18 = local_90;
  local_a5 = cVar26;
  if (uVar30 <= size && uVar28 != 0) {
    if (uVar32 < uVar28) {
      uVar28 = uVar32;
    }
    uStack_b0 = 0x1ee5a8;
    switchD_00b03519::default(str + uVar30,pcVar23 + uVar11,uVar28);
    uVar18 = local_90;
    str = local_88;
    ap = local_a0;
    uVar9 = local_90;
  }
  local_90 = uVar9;
  uVar30 = uVar30 + uVar32;
  if (((byte)local_a4 & (byte)uVar18 & 1) != 0) {
    for (; uVar24 != 0; uVar24 = uVar24 - 1) {
      if (uVar30 < size) {
        str[uVar30] = ' ';
      }
      uVar30 = uVar30 + 1;
    }
  }
LAB_001edc33:
  format = (char *)((byte *)format + 1);
  in_R9 = pcVar27;
  goto LAB_001edc16;
switchD_001edd8a_caseD_9:
  bVar14 = bVar14 | 0x80;
  uVar25 = ap->gp_offset;
  uVar11 = (ulong)uVar25;
  if (bVar14 == 0xfa) {
    if (uVar25 < 0x29) {
      pvVar2 = local_a0->reg_save_area;
LAB_001ee1e4:
      puVar17 = (ulong *)((long)pvVar2 + uVar11);
      local_a0->gp_offset = uVar25 + 8;
    }
    else {
LAB_001ee1eb:
      puVar17 = (ulong *)local_a0->overflow_arg_area;
      local_a0->overflow_arg_area = puVar17 + 1;
    }
LAB_001ee1fc:
    uVar11 = *puVar17;
  }
  else {
    if (bVar14 == 0xea) {
LAB_001edeb6:
      if (0x28 < uVar25) goto LAB_001ee1eb;
      puVar17 = (ulong *)((long)local_a0->reg_save_area + uVar11);
      local_a0->gp_offset = uVar25 + 8;
      goto LAB_001ee1fc;
    }
    if (bVar14 == 0xec) {
      if (uVar25 < 0x29) {
        pvVar2 = local_a0->reg_save_area;
        goto LAB_001ee1e4;
      }
      goto LAB_001ee1eb;
    }
    if (bVar14 == 0xf1) goto LAB_001edeb6;
    if (uVar25 < 0x29) {
      puVar17 = (ulong *)(uVar11 + (long)local_a0->reg_save_area);
      local_a0->gp_offset = uVar25 + 8;
    }
    else {
      puVar17 = (ulong *)local_a0->overflow_arg_area;
      local_a0->overflow_arg_area = puVar17 + 1;
    }
    uVar11 = (ulong)(uint)*puVar17;
  }
  pcVar23 = "0123456789abcdef";
  cVar8 = *f;
  buf[0x40] = '\0';
  if (cVar8 == 'X') {
    pcVar23 = "0123456789ABCDEF";
  }
  lVar29 = 0;
  do {
    pcVar27 = (char *)(ulong)((int)lVar29 + 0x3f);
    in_R8 = (char *)(ulong)(byte)pcVar23[(uint)uVar11 & 0xf];
    buf[(long)pcVar27] = pcVar23[(uint)uVar11 & 0xf];
    lVar29 = lVar29 + -1;
    bVar3 = 0xf < uVar11;
    uVar11 = uVar11 >> 4;
  } while (bVar3);
  pcVar23 = buf;
  if (bVar4) {
    buf[(long)(pcVar27 + -2)] = '0';
    buf[(long)(pcVar27 + -1)] = (cVar8 != 'X') << 5 | 0x58;
    pcVar23 = (char *)((long)&local_7c + 2);
    uVar11 = 2 - lVar29;
  }
  else {
    uVar11 = -lVar29;
  }
  if (uVar21 == 0xffffffff) {
    local_90 = 0;
    uVar32 = 0;
  }
  else {
    uVar32 = 0;
    if (uVar11 <= uVar28) {
      uVar32 = uVar28 - uVar11;
    }
    local_90 = CONCAT71((int7)((ulong)puVar17 >> 8),uVar11 <= uVar28 && uVar28 - uVar11 != 0);
    if (((local_a4 & 1) == 0) && (uVar11 < uVar28)) {
      pcVar1 = str + uVar30;
      uVar28 = 0;
      do {
        if (uVar28 + uVar30 < size) {
          pcVar1[uVar28] = cVar26;
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < uVar32);
      uVar30 = uVar30 + uVar28;
      local_90 = CONCAT71((int7)((ulong)pcVar1 >> 8),1);
    }
  }
  uVar28 = size - uVar30;
  uVar18 = local_90;
  if (uVar30 <= size && uVar28 != 0) {
    if (uVar11 < uVar28) {
      uVar28 = uVar11;
    }
    uStack_b0 = 0x1ee2ec;
    switchD_00b03519::default(str + uVar30,pcVar23 + (long)pcVar27,uVar28);
    uVar18 = local_90;
    str = local_88;
    uVar9 = local_90;
  }
  local_90 = uVar9;
  uVar30 = uVar30 + uVar11;
  ap = local_a0;
  if (((byte)local_a4 & (byte)uVar18 & 1) != 0) {
    for (; uVar32 != 0; uVar32 = uVar32 - 1) {
      if (uVar30 < size) {
        str[uVar30] = ' ';
      }
      uVar30 = uVar30 + 1;
    }
  }
  goto LAB_001edc33;
}

Assistant:

JEMALLOC_COLD
size_t
malloc_vsnprintf(char *str, size_t size, const char *format, va_list ap) {
	size_t i;
	const char *f;

#define APPEND_C(c) do {						\
	if (i < size) {							\
		str[i] = (c);						\
	}								\
	i++;								\
} while (0)
#define APPEND_S(s, slen) do {						\
	if (i < size) {							\
		size_t cpylen = (slen <= size - i) ? slen : size - i;	\
		memcpy(&str[i], s, cpylen);				\
	}								\
	i += slen;							\
} while (0)
#define APPEND_PADDED_S(s, slen, width, left_justify) do {		\
	/* Left padding. */						\
	size_t pad_len = (width == -1) ? 0 : ((slen < (size_t)width) ?	\
	    (size_t)width - slen : 0);					\
	if (!left_justify && pad_len != 0) {				\
		size_t j;						\
		for (j = 0; j < pad_len; j++) {				\
			if (pad_zero) {					\
				APPEND_C('0');				\
			} else {					\
				APPEND_C(' ');				\
			}						\
		}							\
	}								\
	/* Value. */							\
	APPEND_S(s, slen);						\
	/* Right padding. */						\
	if (left_justify && pad_len != 0) {				\
		size_t j;						\
		for (j = 0; j < pad_len; j++) {				\
			APPEND_C(' ');					\
		}							\
	}								\
}